

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void suboption(Curl_easy *data)

{
  uchar uVar1;
  connectdata *pcVar2;
  TELNET *pTVar3;
  uchar *puVar4;
  curl_slist *pcVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ssize_t sVar9;
  uint *puVar10;
  undefined8 uVar11;
  size_t length;
  char *pcVar12;
  uchar temp [2048];
  
  pcVar2 = data->conn;
  pTVar3 = (data->req).p.telnet;
  printsub(data,0x3c,pTVar3->subbuffer,(size_t)(pTVar3->subend + (2 - (long)pTVar3->subpointer)));
  puVar4 = pTVar3->subpointer;
  pTVar3->subpointer = puVar4 + 1;
  uVar1 = *puVar4;
  if (uVar1 == '\'') {
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c",0xff,0xfa,0x27,0);
    length = 4;
    for (pcVar5 = pTVar3->telnet_vars; pcVar5 != (curl_slist *)0x0; pcVar5 = pcVar5->next) {
      pcVar12 = pcVar5->data;
      sVar7 = strlen(pcVar12);
      if (sVar7 + length + 1 < 0x7fa) {
        pcVar8 = strchr(pcVar12,0x2c);
        if (pcVar8 == (char *)0x0) {
          iVar6 = curl_msnprintf((char *)(temp + length),0x800 - length,"%c%s",0,pcVar12);
        }
        else {
          iVar6 = curl_msnprintf((char *)(temp + length),0x800 - length,"%c%.*s%c%s",0,
                                 (ulong)(uint)((int)pcVar8 - (int)pcVar12),pcVar12,1,pcVar8 + 1);
        }
        length = length + (long)iVar6;
      }
    }
    curl_msnprintf((char *)(temp + length),0x800 - length,"%c%c",0xff,0xf0);
    sVar7 = length + 2;
    iVar6 = pcVar2->sock[0];
  }
  else {
    if (uVar1 == '#') {
      pcVar12 = pTVar3->subopt_xdisploc;
      sVar7 = strlen(pcVar12);
      uVar11 = 0x23;
    }
    else {
      if (uVar1 != '\x18') {
        return;
      }
      pcVar12 = pTVar3->subopt_ttype;
      sVar7 = strlen(pcVar12);
      uVar11 = 0x18;
    }
    length = sVar7 + 4;
    sVar7 = sVar7 + 6;
    curl_msnprintf((char *)temp,0x800,"%c%c%c%c%s%c%c",0xff,0xfa,uVar11,0,pcVar12,0xff,0xf0);
    iVar6 = pcVar2->sock[0];
  }
  sVar9 = send(iVar6,temp,sVar7,0x4000);
  if (sVar9 < 0) {
    puVar10 = (uint *)__errno_location();
    Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar10);
  }
  printsub(data,0x3e,temp + 2,length);
  return;
}

Assistant:

static void suboption(struct Curl_easy *data)
{
  struct curl_slist *v;
  unsigned char temp[2048];
  ssize_t bytes_written;
  size_t len;
  int err;
  struct TELNET *tn = data->req.p.telnet;
  struct connectdata *conn = data->conn;

  printsub(data, '<', (unsigned char *)tn->subbuffer, CURL_SB_LEN(tn) + 2);
  switch(CURL_SB_GET(tn)) {
    case CURL_TELOPT_TTYPE:
      len = strlen(tn->subopt_ttype) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_TTYPE,
                CURL_TELQUAL_IS, tn->subopt_ttype, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_XDISPLOC:
      len = strlen(tn->subopt_xdisploc) + 4 + 2;
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c%s%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_XDISPLOC,
                CURL_TELQUAL_IS, tn->subopt_xdisploc, CURL_IAC, CURL_SE);
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
    case CURL_TELOPT_NEW_ENVIRON:
      msnprintf((char *)temp, sizeof(temp),
                "%c%c%c%c", CURL_IAC, CURL_SB, CURL_TELOPT_NEW_ENVIRON,
                CURL_TELQUAL_IS);
      len = 4;

      for(v = tn->telnet_vars; v; v = v->next) {
        size_t tmplen = (strlen(v->data) + 1);
        /* Add the variable if it fits */
        if(len + tmplen < (int)sizeof(temp)-6) {
          char *s = strchr(v->data, ',');
          if(!s)
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%s", CURL_NEW_ENV_VAR, v->data);
          else {
            size_t vlen = s - v->data;
            len += msnprintf((char *)&temp[len], sizeof(temp) - len,
                             "%c%.*s%c%s", CURL_NEW_ENV_VAR,
                             (int)vlen, v->data, CURL_NEW_ENV_VALUE, ++s);
          }
        }
      }
      msnprintf((char *)&temp[len], sizeof(temp) - len,
                "%c%c", CURL_IAC, CURL_SE);
      len += 2;
      bytes_written = swrite(conn->sock[FIRSTSOCKET], temp, len);
      if(bytes_written < 0) {
        err = SOCKERRNO;
        failf(data,"Sending data failed (%d)",err);
      }
      printsub(data, '>', &temp[2], len-2);
      break;
  }
  return;
}